

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_stmt.cc
# Opt level: O1

void init_stmt(module *m)

{
  PyObject *pPVar1;
  class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *pcVar2;
  class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *pcVar3;
  class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *pcVar4;
  class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *pcVar5;
  class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *pcVar6;
  class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt> *cls;
  handle hVar7;
  class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
  *this;
  class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
  *pcVar8;
  class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
  *pcVar9;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> _Var10;
  class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *pcVar11;
  class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
  *pcVar12;
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>
  *this_00;
  class_<kratos::EventControl> *pcVar13;
  class_<kratos::ReturnStmt,_std::shared_ptr<kratos::ReturnStmt>,_kratos::Stmt> local_108;
  class_<kratos::TaskStmtBlock,_std::shared_ptr<kratos::TaskStmtBlock>,_kratos::FunctionStmtBlock>
  local_100;
  class_<kratos::InitialStmtBlock,_std::shared_ptr<kratos::InitialStmtBlock>,_kratos::StmtBlock>
  local_f8;
  class_<kratos::FinalStmtBlock,_std::shared_ptr<kratos::FinalStmtBlock>,_kratos::StmtBlock>
  local_f0;
  handle local_e8;
  undefined8 local_e0;
  class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt> local_d8;
  class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt> assign_;
  class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_> local_c0;
  class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_> stmt_;
  cpp_function local_b0;
  cpp_function cf_8;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_a0;
  undefined8 local_98;
  handle local_90;
  undefined8 local_88;
  handle local_80;
  cpp_function func;
  handle local_70;
  cpp_function cf_1;
  __uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  local_60;
  unique_function_record unique_rec_6;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_50;
  unique_function_record unique_rec;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_40;
  cpp_function cf;
  
  pybind11::class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_>::class_<>
            (&local_c0,(m->super_object).super_handle.m_ptr,"Stmt");
  pybind11::class_<kratos::Stmt,_std::shared_ptr<kratos::Stmt>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            (&local_c0,"__init__",(type *)&local_60,(is_new_style_constructor *)&local_80);
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::Stmt::type;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar2 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<kratos::StatementType(kratos::Stmt::*)()const>
                     ((class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)&local_c0,"type",
                      (offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)0x41;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar2 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<void(kratos::Stmt::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)>
                     (pcVar2,"add_scope_variable",(offset_in_Var_to_subr *)&local_80);
  pPVar1 = *(PyObject **)pcVar2;
  local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"add_scope_variable");
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar7.m_ptr = local_70.m_ptr;
  local_40._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_0,void,kratos::Stmt&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_0&&,void(*)(kratos::Stmt&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "add_scope_variable";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_50._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_40,(unique_function_record *)&local_50,
             "({%}, {str}, {str}, {bool}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_0,void,kratos::Stmt&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_0&&,void(*)(kratos::Stmt&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,4);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&local_70);
  pybind11::object::~object((object *)&local_90);
  pybind11::detail::add_class_method
            ((object *)pcVar2,"add_scope_variable",(cpp_function *)&local_40);
  pybind11::object::~object((object *)&local_40);
  local_40._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_1_const&,std::map<std::__cxx11::string,std::pair<bool,std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>,kratos::Stmt&>(init_stmt(pybind11::module_&)::$_1_const&,std::map<std::__cxx11::string,std::pair<bool,std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>(*)(kratos::Stmt&))
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_40,(unique_function_record *)&local_50,
             "({%}) -> Dict[str, Tuple[bool, str]]",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_1_const&,std::map<std::__cxx11::string,std::pair<bool,std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>,kratos::Stmt&>(init_stmt(pybind11::module_&)::$_1_const&,std::map<std::__cxx11::string,std::pair<bool,std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>(*)(kratos::Stmt&))
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  local_70.m_ptr._0_1_ = 6;
  local_50._M_head_impl = (function_record *)0x0;
  pcVar2 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def_property<pybind11::cpp_function,decltype(nullptr),pybind11::return_value_policy>
                     (pcVar2,"scope_context",(cpp_function *)&local_40,&local_50._M_head_impl,
                      (return_value_policy *)&local_70);
  pybind11::object::~object((object *)&local_40);
  local_50._M_head_impl = (function_record *)0x39;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar2 = (class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>> *)
           pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
           def<void(kratos::Stmt::*)(kratos::IRNode*)>
                     (pcVar2,"set_parent",(offset_in_Var_to_subr *)&local_50);
  local_40._M_head_impl = (function_record *)0x59;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>::
  def<std::shared_ptr<kratos::Stmt>(kratos::Stmt::*)()const>
            (pcVar2,"clone",(offset_in_Var_to_subr *)&local_40);
  def_trace<pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>,kratos::Stmt>(&local_c0);
  def_attributes<pybind11::class_<kratos::Stmt,std::shared_ptr<kratos::Stmt>>,kratos::Stmt>
            (&local_c0);
  pybind11::class_<kratos::AssignStmt,_std::shared_ptr<kratos::AssignStmt>,_kratos::Stmt>::
  class_<char[21]>(&local_d8,(m->super_object).super_handle.m_ptr,"AssignStmt",
                   (char (*) [21])"Assignment statement");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::AssignStmt::assign_type;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar3 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def<kratos::AssignmentType(kratos::AssignStmt::*)()const>
                     ((class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *
                      )&local_d8,"assign_type",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::AssignStmt::set_assign_type;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar3 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def<void(kratos::AssignStmt::*)(kratos::AssignmentType)>
                     (pcVar3,"set_assign_type",(offset_in_Var_to_subr *)&local_80);
  local_90.m_ptr._0_1_ = 5;
  local_40._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_2_const&,kratos::Var*,kratos::AssignStmt_const&>(init_stmt(pybind11::module_&)::$_2_const&,kratos::Var*(*)(kratos::AssignStmt_const&))
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_40,(unique_function_record *)&local_50,
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_2_const&,kratos::Var*,kratos::AssignStmt_const&>(init_stmt(pybind11::module_&)::$_2_const&,kratos::Var*(*)(kratos::AssignStmt_const&))
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_2_const&,kratos::Var*,kratos::AssignStmt_const&>(init_stmt(pybind11::module_&)::$_2_const&,kratos::Var*(*)(kratos::AssignStmt_const&))
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  local_70.m_ptr._0_1_ = 6;
  local_50._M_head_impl = (function_record *)0x0;
  pcVar3 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def_property<pybind11::cpp_function,decltype(nullptr),pybind11::return_value_policy,pybind11::return_value_policy>
                     (pcVar3,"left",(cpp_function *)&local_40,&local_50._M_head_impl,
                      (return_value_policy *)&local_70,(return_value_policy *)&local_90);
  pybind11::object::~object((object *)&local_40);
  local_a0._M_head_impl._0_1_ = 5;
  local_40._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_3_const&,kratos::Var*,kratos::AssignStmt_const&>(init_stmt(pybind11::module_&)::$_3_const&,kratos::Var*(*)(kratos::AssignStmt_const&))
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_40,(unique_function_record *)&local_50,
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_3_const&,kratos::Var*,kratos::AssignStmt_const&>(init_stmt(pybind11::module_&)::$_3_const&,kratos::Var*(*)(kratos::AssignStmt_const&))
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_3_const&,kratos::Var*,kratos::AssignStmt_const&>(init_stmt(pybind11::module_&)::$_3_const&,kratos::Var*(*)(kratos::AssignStmt_const&))
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  local_70.m_ptr._0_1_ = 6;
  local_50._M_head_impl = (function_record *)0x0;
  pcVar3 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def_property<pybind11::cpp_function,decltype(nullptr),pybind11::return_value_policy,pybind11::return_value_policy>
                     (pcVar3,"right",(cpp_function *)&local_40,&local_50._M_head_impl,
                      (return_value_policy *)&local_70,(return_value_policy *)&local_a0);
  pybind11::object::~object((object *)&local_40);
  local_50._M_head_impl = (function_record *)kratos::AssignStmt::get_delay;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  local_40._M_head_impl = (function_record *)kratos::AssignStmt::set_delay;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar3 = (class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
           def_property<std::optional<kratos::EventControl>const&(kratos::AssignStmt::*)()const,void(kratos::AssignStmt::*)(std::optional<kratos::EventControl>)>
                     (pcVar3,"delay",(offset_in_Var_to_subr *)&local_50,
                      (offset_in_Var_to_subr *)&local_40);
  local_70.m_ptr = (PyObject *)kratos::AssignStmt::has_delay;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::class_<kratos::AssignStmt,std::shared_ptr<kratos::AssignStmt>,kratos::Stmt>::
  def_property_readonly<bool(kratos::AssignStmt::*)()const>
            (pcVar3,"has_delay",(offset_in_Var_to_subr *)&local_70);
  pybind11::class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt>::class_<>
            ((class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt> *)&stmt_,
             (m->super_object).super_handle.m_ptr,"IfStmt");
  pybind11::class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::IfStmt,_std::shared_ptr<kratos::IfStmt>,_kratos::Stmt> *)&stmt_,
             "__init__",(type *)&local_60,(is_new_style_constructor *)&local_80);
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::IfStmt::predicate;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  assign_.super_generic_type.super_object.super_handle.m_ptr._0_1_ = 5;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::Var>(kratos::IfStmt::*)()const,pybind11::return_value_policy>
                     ((class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)&stmt_,
                      "predicate",(offset_in_Var_to_subr *)&local_60,(return_value_policy *)&assign_
                     );
  local_80.m_ptr = (PyObject *)kratos::IfStmt::then_body;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar4,"then_body",(offset_in_Var_to_subr *)&local_80);
  local_50._M_head_impl = (function_record *)kratos::IfStmt::then_body;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def_property_readonly<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar4,"then_",(offset_in_Var_to_subr *)&local_50);
  local_40._M_head_impl = (function_record *)kratos::IfStmt::else_body;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def_property_readonly<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar4,"else_",(offset_in_Var_to_subr *)&local_40);
  local_70.m_ptr = (PyObject *)kratos::IfStmt::else_body;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::ScopedStmtBlock>const&(kratos::IfStmt::*)()const>
                     (pcVar4,"else_body",(offset_in_Var_to_subr *)&local_70);
  local_90.m_ptr = (PyObject *)kratos::IfStmt::add_then_stmt;
  local_88 = 0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar4,"add_then_stmt",(offset_in_Var_to_subr *)&local_90);
  local_a0._M_head_impl = (function_record *)kratos::IfStmt::add_else_stmt;
  local_98 = 0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar4,"add_else_stmt",(offset_in_Var_to_subr *)&local_a0);
  local_b0.super_function.super_object.super_handle.m_ptr =
       (function)kratos::IfStmt::remove_then_stmt;
  cf_8.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar4 = (class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
           def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar4,"remove_then_stmt",(offset_in_Var_to_subr *)&local_b0);
  local_e8.m_ptr = (PyObject *)kratos::IfStmt::remove_else_stmt;
  local_e0 = 0;
  pybind11::class_<kratos::IfStmt,std::shared_ptr<kratos::IfStmt>,kratos::Stmt>::
  def<void(kratos::IfStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
            (pcVar4,"remove_else_stmt",(offset_in_Var_to_subr *)&local_e8);
  pybind11::object::~object((object *)&stmt_);
  pybind11::class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt>::class_<>
            ((class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt> *)
             &local_a0,(m->super_object).super_handle.m_ptr,"SwitchStmt");
  pybind11::class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::SwitchStmt,_std::shared_ptr<kratos::SwitchStmt>,_kratos::Stmt> *)
             &local_a0,"__init__",(type *)&local_60,(is_new_style_constructor *)&local_80);
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::SwitchStmt::add_switch_case;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar5 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<kratos::ScopedStmtBlock&(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&)>
                     ((class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *
                      )&local_a0,"add_switch_case",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::SwitchStmt::add_switch_case;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar5 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<kratos::ScopedStmtBlock&(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>const&)>
                     (pcVar5,"add_switch_case",(offset_in_Var_to_subr *)&local_80);
  local_50._M_head_impl = (function_record *)kratos::SwitchStmt::target;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  local_b0.super_function.super_object.super_handle.m_ptr._0_1_ = 5;
  pcVar5 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<std::shared_ptr<kratos::Var>(kratos::SwitchStmt::*)()const,pybind11::return_value_policy>
                     (pcVar5,"target",(offset_in_Var_to_subr *)&local_50,
                      (return_value_policy *)&local_b0);
  local_40._M_head_impl = (function_record *)kratos::SwitchStmt::body;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar5 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<std::map<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::ScopedStmtBlock>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>const&(kratos::SwitchStmt::*)()const>
                     (pcVar5,"body",(offset_in_Var_to_subr *)&local_40);
  local_70.m_ptr = (PyObject *)kratos::SwitchStmt::remove_switch_case;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar5 = (class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt> *)
           pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
           def<void(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&)>
                     (pcVar5,"remove_switch_case",(offset_in_Var_to_subr *)&local_70);
  local_90.m_ptr = (PyObject *)kratos::SwitchStmt::remove_switch_case;
  local_88 = 0;
  pybind11::class_<kratos::SwitchStmt,std::shared_ptr<kratos::SwitchStmt>,kratos::Stmt>::
  def<void(kratos::SwitchStmt::*)(std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::Stmt>const&)>
            (pcVar5,"remove_switch_case",(offset_in_Var_to_subr *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt>::class_<>
            ((class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt> *)
             &local_b0,(m->super_object).super_handle.m_ptr,"StmtBlock");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::StmtBlock::block_type;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar6 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<kratos::StatementBlockType(kratos::StmtBlock::*)()const>
                     ((class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
                      &local_b0,"block_type",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::StmtBlock::add_stmt;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar6 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<void(kratos::StmtBlock::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar6,"add_stmt",(offset_in_Var_to_subr *)&local_80);
  local_50._M_head_impl = (function_record *)0x51;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar6 = (class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt> *)
           pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
           def<void(kratos::StmtBlock::*)(std::shared_ptr<kratos::Stmt>const&)>
                     (pcVar6,"remove_stmt",(offset_in_Var_to_subr *)&local_50);
  local_e8.m_ptr = (PyObject *)add_function_call_var;
  cls = pybind11::class_<kratos::StmtBlock,std::shared_ptr<kratos::StmtBlock>,kratos::Stmt>::
        def<void(*)(kratos::StmtBlock&,std::shared_ptr<kratos::FunctionCallVar>const&)>
                  (pcVar6,"add_stmt",
                   (_func_void_StmtBlock_ptr_shared_ptr<kratos::FunctionCallVar>_ptr **)&local_e8);
  pPVar1 = (cls->super_generic_type).super_object.super_handle.m_ptr;
  local_a0._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__getitem__");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_90.m_ptr;
  }
  local_90.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_90.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  (local_40._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_4,std::shared_ptr<kratos::Stmt>,kratos::StmtBlock&,int,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_4&&,std::shared_ptr<kratos::Stmt>(*)(kratos::StmtBlock&,int),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_40._M_head_impl)->name = "__getitem__";
  (local_40._M_head_impl)->field_0x59 = (local_40._M_head_impl)->field_0x59 | 0x10;
  ((local_40._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_40._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_70,(unique_function_record *)&local_40,"({%}, {int}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_4,std::shared_ptr<kratos::Stmt>,kratos::StmtBlock&,int,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_4&&,std::shared_ptr<kratos::Stmt>(*)(kratos::StmtBlock&,int),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_40);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::detail::add_class_method((object *)cls,"__getitem__",(cpp_function *)&local_70);
  pybind11::object::~object((object *)&local_70);
  pPVar1 = (cls->super_generic_type).super_object.super_handle.m_ptr;
  local_a0._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__setitem__");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_90.m_ptr;
  }
  local_90.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_90.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  (local_40._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_5,void,kratos::StmtBlock&,int,std::shared_ptr<kratos::Stmt>const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_5&&,void(*)(kratos::StmtBlock&,int,std::shared_ptr<kratos::Stmt>const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_40._M_head_impl)->name = "__setitem__";
  (local_40._M_head_impl)->field_0x59 = (local_40._M_head_impl)->field_0x59 | 0x10;
  ((local_40._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_40._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_70,(unique_function_record *)&local_40,
             "({%}, {int}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_5,void,kratos::StmtBlock&,int,std::shared_ptr<kratos::Stmt>const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_5&&,void(*)(kratos::StmtBlock&,int,std::shared_ptr<kratos::Stmt>const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,3);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_40);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::detail::add_class_method((object *)cls,"__setitem__",(cpp_function *)&local_70);
  pybind11::object::~object((object *)&local_70);
  pPVar1 = (cls->super_generic_type).super_object.super_handle.m_ptr;
  local_a0._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__len__");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_90.m_ptr;
  }
  local_90.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_90.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  (local_40._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_6,unsigned_long,kratos::StmtBlock&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_6&&,unsigned_long(*)(kratos::StmtBlock&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_40._M_head_impl)->name = "__len__";
  (local_40._M_head_impl)->field_0x59 = (local_40._M_head_impl)->field_0x59 | 0x10;
  ((local_40._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_40._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_70,(unique_function_record *)&local_40,"({%}) -> int",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_6,unsigned_long,kratos::StmtBlock&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_6&&,unsigned_long(*)(kratos::StmtBlock&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_40);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::detail::add_class_method((object *)cls,"__len__",(cpp_function *)&local_70);
  pybind11::object::~object((object *)&local_70);
  pPVar1 = (cls->super_generic_type).super_object.super_handle.m_ptr;
  local_a0._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__iter__");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_90.m_ptr;
  }
  local_90.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_90.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  (local_40._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_7,pybind11::iterator,kratos::StmtBlock&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::keep_alive<0ul,1ul>>(init_stmt(pybind11::module_&)::$_7&&,pybind11::iterator(*)(kratos::StmtBlock&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::keep_alive<0ul,1ul>const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_40._M_head_impl)->name = "__iter__";
  (local_40._M_head_impl)->field_0x59 = (local_40._M_head_impl)->field_0x59 | 0x10;
  ((local_40._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_40._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_70,(unique_function_record *)&local_40,"({%}) -> Iterator",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_7,pybind11::iterator,kratos::StmtBlock&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::keep_alive<0ul,1ul>>(init_stmt(pybind11::module_&)::$_7&&,pybind11::iterator(*)(kratos::StmtBlock&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::keep_alive<0ul,1ul>const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_40);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::detail::add_class_method((object *)cls,"__iter__",(cpp_function *)&local_70);
  pybind11::object::~object((object *)&local_70);
  pybind11::object::~object((object *)&local_b0);
  pybind11::
  class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
  ::class_<>((class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
              *)&local_50,(m->super_object).super_handle.m_ptr,"CombinationalStmtBlock");
  pybind11::
  class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::CombinationalStmtBlock,_std::shared_ptr<kratos::CombinationalStmtBlock>,_kratos::StmtBlock>
              *)&local_50,"__init__",(type *)&local_60,(is_new_style_constructor *)&local_80);
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::CombinationalStmtBlock::is_general_purpose;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  local_80.m_ptr = (PyObject *)kratos::CombinationalStmtBlock::set_general_purpose;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::
  class_<kratos::CombinationalStmtBlock,std::shared_ptr<kratos::CombinationalStmtBlock>,kratos::StmtBlock>
  ::
  def_property<bool(kratos::CombinationalStmtBlock::*)()const,void(kratos::CombinationalStmtBlock::*)(bool)>
            ((class_<kratos::CombinationalStmtBlock,std::shared_ptr<kratos::CombinationalStmtBlock>,kratos::StmtBlock>
              *)&local_50,"general_purpose",(offset_in_Var_to_subr *)&local_60,
             (offset_in_Var_to_subr *)&local_80);
  pybind11::object::~object((object *)&local_50);
  pybind11::
  class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>::
  class_<>((class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>
            *)&local_60,(m->super_object).super_handle.m_ptr,"LatchStmtBlock");
  pybind11::
  class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::LatchStmtBlock,_std::shared_ptr<kratos::LatchStmtBlock>,_kratos::StmtBlock>
              *)&local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::
  class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>::
  class_<>((class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>
            *)&local_60,(m->super_object).super_handle.m_ptr,"ScopedStmtBlock");
  pybind11::
  class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::ScopedStmtBlock,_std::shared_ptr<kratos::ScopedStmtBlock>,_kratos::StmtBlock>
              *)&local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::
  class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
  ::class_<>((class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
              *)&local_50,(m->super_object).super_handle.m_ptr,"SequentialStmtBlock");
  pybind11::
  class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::SequentialStmtBlock,_std::shared_ptr<kratos::SequentialStmtBlock>,_kratos::StmtBlock>
              *)&local_50,"__init__",(type *)&local_60,(is_new_style_constructor *)&local_80);
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::SequentialStmtBlock::get_event_controls;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  this = (class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
          *)pybind11::
            class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
            ::
            def<std::vector<kratos::EventControl,std::allocator<kratos::EventControl>>&(kratos::SequentialStmtBlock::*)()>
                      ((class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
                        *)&local_50,"get_event_controls",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::SequentialStmtBlock::add_condition;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::
  class_<kratos::SequentialStmtBlock,std::shared_ptr<kratos::SequentialStmtBlock>,kratos::StmtBlock>
  ::
  def<void(kratos::SequentialStmtBlock::*)(std::pair<kratos::EventEdgeType,std::shared_ptr<kratos::Var>>const&)>
            (this,"add_condition",(offset_in_Var_to_subr *)&local_80);
  pybind11::object::~object((object *)&local_50);
  pybind11::
  class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
  ::class_<>((class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
              *)&local_60,(m->super_object).super_handle.m_ptr,"ModuleInstantiationStmt");
  pybind11::
  class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::ModuleInstantiationStmt,_std::shared_ptr<kratos::ModuleInstantiationStmt>,_kratos::Stmt>
              *)&local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::class_<kratos::ReturnStmt,_std::shared_ptr<kratos::ReturnStmt>,_kratos::Stmt>::class_<>
            (&local_108,(m->super_object).super_handle.m_ptr,"ReturnStmt");
  pybind11::object::~object((object *)&local_108);
  pybind11::
  class_<kratos::FunctionStmtBlock,_std::shared_ptr<kratos::FunctionStmtBlock>,_kratos::StmtBlock>::
  class_<>((class_<kratos::FunctionStmtBlock,_std::shared_ptr<kratos::FunctionStmtBlock>,_kratos::StmtBlock>
            *)&local_90,(m->super_object).super_handle.m_ptr,"FunctionStmtBlock");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )(_Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x69;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar8 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::FunctionStmtBlock::*)(std::__cxx11::string_const&,unsigned_int,bool)>
                        ((class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
                          *)&local_90,"input",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::FunctionStmtBlock::return_stmt;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar8 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<std::shared_ptr<kratos::ReturnStmt>(kratos::FunctionStmtBlock::*)(std::shared_ptr<kratos::Var>const&)>
                        (pcVar8,"return_stmt",(offset_in_Var_to_subr *)&local_80);
  local_50._M_head_impl = (function_record *)kratos::FunctionStmtBlock::get_port;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar8 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::FunctionStmtBlock::*)(std::__cxx11::string_const&)>
                        (pcVar8,"get_port",(offset_in_Var_to_subr *)&local_50);
  local_40._M_head_impl = (function_record *)kratos::FunctionStmtBlock::set_port_ordering;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar8 = (class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
            *)pybind11::
              class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>
              ::
              def<void(kratos::FunctionStmtBlock::*)(std::map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>const&)>
                        (pcVar8,"set_port_ordering",(offset_in_Var_to_subr *)&local_40);
  local_70.m_ptr = (PyObject *)kratos::FunctionStmtBlock::set_port_ordering;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::
  class_<kratos::FunctionStmtBlock,std::shared_ptr<kratos::FunctionStmtBlock>,kratos::StmtBlock>::
  def<void(kratos::FunctionStmtBlock::*)(std::map<unsigned_int,std::__cxx11::string,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>const&)>
            (pcVar8,"set_port_ordering",(offset_in_Var_to_subr *)&local_70);
  pybind11::object::~object((object *)&local_90);
  pybind11::
  class_<kratos::TaskStmtBlock,_std::shared_ptr<kratos::TaskStmtBlock>,_kratos::FunctionStmtBlock>::
  class_<>(&local_100,(m->super_object).super_handle.m_ptr,"TaskStmtBlock");
  pybind11::object::~object((object *)&local_100);
  pybind11::
  class_<kratos::DPIFunctionStmtBlock,_std::shared_ptr<kratos::DPIFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  ::class_<>((class_<kratos::DPIFunctionStmtBlock,_std::shared_ptr<kratos::DPIFunctionStmtBlock>,_kratos::FunctionStmtBlock>
              *)&local_b0,(m->super_object).super_handle.m_ptr,"DPIFunctionStmtBlock");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )(_Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x69;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar9 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::DPIFunctionStmtBlock::*)(std::__cxx11::string_const&,unsigned_int,bool)>
                        ((class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
                          *)&local_b0,"input",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::DPIFunctionStmtBlock::output;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar9 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::
              def<std::shared_ptr<kratos::Port>(kratos::DPIFunctionStmtBlock::*)(std::__cxx11::string_const&,unsigned_int,bool)>
                        (pcVar9,"output",(offset_in_Var_to_subr *)&local_80);
  local_50._M_head_impl = (function_record *)kratos::DPIFunctionStmtBlock::set_return_width;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar9 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<void(kratos::DPIFunctionStmtBlock::*)(unsigned_int)>
                        (pcVar9,"set_return_width",(offset_in_Var_to_subr *)&local_50);
  local_40._M_head_impl = (function_record *)kratos::DPIFunctionStmtBlock::is_pure;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar9 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<bool(kratos::DPIFunctionStmtBlock::*)()const>
                        (pcVar9,"is_pure",(offset_in_Var_to_subr *)&local_40);
  local_70.m_ptr = (PyObject *)kratos::DPIFunctionStmtBlock::is_context;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar9 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<bool(kratos::DPIFunctionStmtBlock::*)()const>
                        (pcVar9,"is_context",(offset_in_Var_to_subr *)&local_70);
  local_90.m_ptr = (PyObject *)kratos::DPIFunctionStmtBlock::set_is_pure;
  local_88 = 0;
  pcVar9 = (class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
            *)pybind11::
              class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
              ::def<void(kratos::DPIFunctionStmtBlock::*)(bool)>
                        (pcVar9,"set_is_pure",(offset_in_Var_to_subr *)&local_90);
  local_a0._M_head_impl = (function_record *)kratos::DPIFunctionStmtBlock::set_is_context;
  local_98 = 0;
  pybind11::
  class_<kratos::DPIFunctionStmtBlock,std::shared_ptr<kratos::DPIFunctionStmtBlock>,kratos::FunctionStmtBlock>
  ::def<void(kratos::DPIFunctionStmtBlock::*)(bool)>
            (pcVar9,"set_is_context",(offset_in_Var_to_subr *)&local_a0);
  pybind11::object::~object((object *)&local_b0);
  pybind11::
  class_<kratos::BuiltInFunctionStmtBlock,_std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,_kratos::FunctionStmtBlock>
  ::class_<>((class_<kratos::BuiltInFunctionStmtBlock,_std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,_kratos::FunctionStmtBlock>
              *)&local_80,(m->super_object).super_handle.m_ptr,"BuiltInFunctionStmtBlock");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::BuiltInFunctionStmtBlock::return_width;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pybind11::
  class_<kratos::BuiltInFunctionStmtBlock,std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,kratos::FunctionStmtBlock>
  ::def<unsigned_int(kratos::BuiltInFunctionStmtBlock::*)()const>
            ((class_<kratos::BuiltInFunctionStmtBlock,std::shared_ptr<kratos::BuiltInFunctionStmtBlock>,kratos::FunctionStmtBlock>
              *)&local_80,"return_width",(offset_in_Var_to_subr *)&local_60);
  pybind11::object::~object((object *)&local_80);
  pybind11::
  class_<kratos::InitialStmtBlock,_std::shared_ptr<kratos::InitialStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_f8,(m->super_object).super_handle.m_ptr,"InitialStmtBlock");
  pybind11::object::~object((object *)&local_f8);
  pybind11::
  class_<kratos::FinalStmtBlock,_std::shared_ptr<kratos::FinalStmtBlock>,_kratos::StmtBlock>::
  class_<>(&local_f0,(m->super_object).super_handle.m_ptr,"FinalStmtBlock");
  pybind11::object::~object((object *)&local_f0);
  pybind11::class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt>::
  class_<>((class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt> *)
           &local_60,(m->super_object).super_handle.m_ptr,"CommentStmt");
  pybind11::class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::CommentStmt,_std::shared_ptr<kratos::CommentStmt>,_kratos::Stmt> *)
             &local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pPVar1 = (m->super_object).super_handle.m_ptr;
  local_40._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  _Var10._M_head_impl = (function_record *)PyObject_GetAttrString(pPVar1,"comment");
  if (_Var10._M_head_impl == (function_record *)0x0) {
    PyErr_Clear();
    local_50._M_head_impl = (function_record *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    _Var10._M_head_impl = local_50._M_head_impl;
  }
  local_50._M_head_impl = _Var10._M_head_impl;
  _Var10._M_head_impl = local_50._M_head_impl;
  local_80.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_60);
  *(code **)((long)local_60._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_8,std::shared_ptr<kratos::CommentStmt>,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling>(init_stmt(pybind11::module_&)::$_8&&,std::shared_ptr<kratos::CommentStmt>(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_60._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "comment";
  ((handle *)
  ((long)local_60._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_60._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = (PyObject *)_Var10._M_head_impl;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_80,(unique_function_record *)&local_60,"({str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_8,std::shared_ptr<kratos::CommentStmt>,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling>(init_stmt(pybind11::module_&)::$_8&&,std::shared_ptr<kratos::CommentStmt>(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_60);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::module_::add_object(m,"comment",local_80,true);
  pybind11::object::~object((object *)&local_80);
  pPVar1 = (m->super_object).super_handle.m_ptr;
  local_40._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  _Var10._M_head_impl = (function_record *)PyObject_GetAttrString(pPVar1,"comment");
  if (_Var10._M_head_impl == (function_record *)0x0) {
    PyErr_Clear();
    local_50._M_head_impl = (function_record *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    _Var10._M_head_impl = local_50._M_head_impl;
  }
  local_50._M_head_impl = _Var10._M_head_impl;
  _Var10._M_head_impl = local_50._M_head_impl;
  local_80.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_60);
  *(code **)((long)local_60._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_9,std::shared_ptr<kratos::CommentStmt>,std::__cxx11::string_const&,unsigned_int,pybind11::name,pybind11::scope,pybind11::sibling>(init_stmt(pybind11::module_&)::$_9&&,std::shared_ptr<kratos::CommentStmt>(*)(std::__cxx11::string_const&,unsigned_int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_60._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "comment";
  ((handle *)
  ((long)local_60._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_60._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = (PyObject *)_Var10._M_head_impl;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_80,(unique_function_record *)&local_60,"({str}, {int}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_9,std::shared_ptr<kratos::CommentStmt>,std::__cxx11::string_const&,unsigned_int,pybind11::name,pybind11::scope,pybind11::sibling>(init_stmt(pybind11::module_&)::$_9&&,std::shared_ptr<kratos::CommentStmt>(*)(std::__cxx11::string_const&,unsigned_int),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_60);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::module_::add_object(m,"comment",local_80,true);
  pybind11::object::~object((object *)&local_80);
  pybind11::class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt>::
  class_<>((class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt> *)
           &local_60,(m->super_object).super_handle.m_ptr,"RawStringStmt");
  pybind11::class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt> *)
             &local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::RawStringStmt,_std::shared_ptr<kratos::RawStringStmt>,_kratos::Stmt> *)
             &local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt>::class_<>
            ((class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt> *)&local_a0,
             (m->super_object).super_handle.m_ptr,"ForStmt");
  pybind11::class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::ForStmt,_std::shared_ptr<kratos::ForStmt>,_kratos::Stmt> *)&local_a0,
             "__init__",(type *)&local_60,(is_new_style_constructor *)&local_80);
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::ForStmt::get_iter_var;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar11 = (class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
            pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
            def<std::shared_ptr<kratos::IterVar>(kratos::ForStmt::*)()const>
                      ((class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
                       &local_a0,"get_iter_var",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::ForStmt::add_stmt;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar11 = (class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt> *)
            pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
            def<void(kratos::ForStmt::*)(std::shared_ptr<kratos::Stmt>const&)>
                      (pcVar11,"add_stmt",(offset_in_Var_to_subr *)&local_80);
  pPVar1 = *(PyObject **)pcVar11;
  local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"add_stmt");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_70.m_ptr;
  }
  local_70.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_70.m_ptr;
  local_40._M_head_impl = (function_record *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_10,void,kratos::ForStmt&,std::shared_ptr<kratos::FunctionCallVar>const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_10&&,void(*)(kratos::ForStmt&,std::shared_ptr<kratos::FunctionCallVar>const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "add_stmt";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_50._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_40,(unique_function_record *)&local_50,"({%}, {%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_10,void,kratos::ForStmt&,std::shared_ptr<kratos::FunctionCallVar>const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_10&&,void(*)(kratos::ForStmt&,std::shared_ptr<kratos::FunctionCallVar>const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&local_70);
  pybind11::object::~object((object *)&local_90);
  pybind11::detail::add_class_method((object *)pcVar11,"add_stmt",(cpp_function *)&local_40);
  pybind11::object::~object((object *)&local_40);
  local_50._M_head_impl = (function_record *)kratos::ForStmt::get_loop_body;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pybind11::class_<kratos::ForStmt,std::shared_ptr<kratos::ForStmt>,kratos::Stmt>::
  def<std::shared_ptr<kratos::ScopedStmtBlock>(kratos::ForStmt::*)()const>
            (pcVar11,"get_loop_body",(offset_in_Var_to_subr *)&local_50);
  pybind11::object::~object((object *)&local_a0);
  pybind11::class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt>::class_<>
            ((class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt> *)
             &local_60,(m->super_object).super_handle.m_ptr,"BreakStmt");
  pybind11::class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::BreakStmt,_std::shared_ptr<kratos::BreakStmt>,_kratos::Stmt> *)
             &local_60,"__init__",(type *)&local_80,(is_new_style_constructor *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::class_<kratos::AuxiliaryStmt,_std::shared_ptr<kratos::AuxiliaryStmt>,_kratos::Stmt>::
  class_<>((class_<kratos::AuxiliaryStmt,_std::shared_ptr<kratos::AuxiliaryStmt>,_kratos::Stmt> *)
           &local_80,(m->super_object).super_handle.m_ptr,"AuxiliaryStmt");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::AuxiliaryStmt::aux_type;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pybind11::class_<kratos::AuxiliaryStmt,std::shared_ptr<kratos::AuxiliaryStmt>,kratos::Stmt>::
  def<kratos::AuxiliaryType(kratos::AuxiliaryStmt::*)()const>
            ((class_<kratos::AuxiliaryStmt,std::shared_ptr<kratos::AuxiliaryStmt>,kratos::Stmt> *)
             &local_80,"aux",(offset_in_Var_to_subr *)&local_60);
  pybind11::object::~object((object *)&local_80);
  pybind11::
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  ::class_<>((class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
              *)&assign_,(m->super_object).super_handle.m_ptr,"EventTracingStmt");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::EventTracingStmt::terminates;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar12 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)()>
                         ((class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
                           *)&assign_,"terminates",(offset_in_Var_to_subr *)&local_60);
  local_80.m_ptr = (PyObject *)kratos::EventTracingStmt::terminates;
  func.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar12 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&)>
                         (pcVar12,"terminates",(offset_in_Var_to_subr *)&local_80);
  local_50._M_head_impl = (function_record *)kratos::EventTracingStmt::belongs;
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar12 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&)>
                         (pcVar12,"belongs",(offset_in_Var_to_subr *)&local_50);
  pPVar1 = *(PyObject **)pcVar12;
  local_a0._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"belongs");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_90.m_ptr;
  }
  local_90.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_90.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  (local_40._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_11,std::shared_ptr<kratos::EventTracingStmt>,kratos::EventTracingStmt&,kratos::Transaction_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_11&&,std::shared_ptr<kratos::EventTracingStmt>(*)(kratos::EventTracingStmt&,kratos::Transaction_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_40._M_head_impl)->name = "belongs";
  (local_40._M_head_impl)->field_0x59 = (local_40._M_head_impl)->field_0x59 | 0x10;
  ((local_40._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_40._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_70,(unique_function_record *)&local_40,
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_11,std::shared_ptr<kratos::EventTracingStmt>,kratos::EventTracingStmt&,kratos::Transaction_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_11&&,std::shared_ptr<kratos::EventTracingStmt>(*)(kratos::EventTracingStmt&,kratos::Transaction_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::signature,
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_11,std::shared_ptr<kratos::EventTracingStmt>,kratos::EventTracingStmt&,kratos::Transaction_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_11&&,std::shared_ptr<kratos::EventTracingStmt>(*)(kratos::EventTracingStmt&,kratos::Transaction_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_40);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::detail::add_class_method((object *)pcVar12,"belongs",(cpp_function *)&local_70);
  pybind11::object::~object((object *)&local_70);
  pPVar1 = *(PyObject **)pcVar12;
  local_a0._M_head_impl = (function_record *)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"belongs");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_90.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_90.m_ptr;
  }
  local_90.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_90.m_ptr;
  local_70.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  (local_40._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_12,std::shared_ptr<kratos::EventTracingStmt>,kratos::EventTracingStmt&,kratos::Transaction_const&,std::__cxx11::string_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_12&&,std::shared_ptr<kratos::EventTracingStmt>(*)(kratos::EventTracingStmt&,kratos::Transaction_const&,std::__cxx11::string_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_40._M_head_impl)->name = "belongs";
  (local_40._M_head_impl)->field_0x59 = (local_40._M_head_impl)->field_0x59 | 0x10;
  ((local_40._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_40._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_70,(unique_function_record *)&local_40,
             "({%}, {%}, {str}, {int}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_12,std::shared_ptr<kratos::EventTracingStmt>,kratos::EventTracingStmt&,kratos::Transaction_const&,std::__cxx11::string_const&,unsigned_long,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_12&&,std::shared_ptr<kratos::EventTracingStmt>(*)(kratos::EventTracingStmt&,kratos::Transaction_const&,std::__cxx11::string_const&,unsigned_long),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,4);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_40);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_a0);
  pybind11::detail::add_class_method((object *)pcVar12,"belongs",(cpp_function *)&local_70);
  pybind11::object::~object((object *)&local_70);
  local_40._M_head_impl = (function_record *)kratos::EventTracingStmt::starts;
  cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar12 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)()>
                         (pcVar12,"starts",(offset_in_Var_to_subr *)&local_40);
  local_70.m_ptr = (PyObject *)kratos::EventTracingStmt::starts;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar12 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&)>
                         (pcVar12,"starts",(offset_in_Var_to_subr *)&local_70);
  local_90.m_ptr = (PyObject *)kratos::EventTracingStmt::matches;
  local_88 = 0;
  pcVar12 = (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
             *)pybind11::
               class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
               ::
               def<std::shared_ptr<kratos::EventTracingStmt>(kratos::EventTracingStmt::*)(std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&)>
                         (pcVar12,"matches",(offset_in_Var_to_subr *)&local_90);
  pPVar1 = *(PyObject **)pcVar12;
  stmt_.super_generic_type.super_object.super_handle.m_ptr = (generic_type)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar7.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"matches");
  if (hVar7.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_e8.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar7.m_ptr = local_e8.m_ptr;
  }
  local_e8.m_ptr = hVar7.m_ptr;
  hVar7.m_ptr = local_e8.m_ptr;
  local_b0.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_a0);
  _Var10._M_head_impl = local_a0._M_head_impl;
  (local_a0._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_stmt(pybind11::module_&)::$_13,std::shared_ptr<kratos::EventTracingStmt>,std::shared_ptr<kratos::EventTracingStmt>&,pybind11::kwargs_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_13&&,std::shared_ptr<kratos::EventTracingStmt>(*)(std::shared_ptr<kratos::EventTracingStmt>&,pybind11::kwargs_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_a0._M_head_impl)->name = "matches";
  (local_a0._M_head_impl)->field_0x59 = (local_a0._M_head_impl)->field_0x59 | 0x10;
  ((local_a0._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_a0._M_head_impl)->sibling).m_ptr = hVar7.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&local_b0,(unique_function_record *)&local_a0,"({%}, {**kwargs}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_stmt(pybind11::module_&)::$_13,std::shared_ptr<kratos::EventTracingStmt>,std::shared_ptr<kratos::EventTracingStmt>&,pybind11::kwargs_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_stmt(pybind11::module_&)::$_13&&,std::shared_ptr<kratos::EventTracingStmt>(*)(std::shared_ptr<kratos::EventTracingStmt>&,pybind11::kwargs_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  (_Var10._M_head_impl)->field_0x59 = (_Var10._M_head_impl)->field_0x59 | 0x40;
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_a0);
  pybind11::object::~object((object *)&local_e8);
  pybind11::object::~object((object *)&stmt_);
  pybind11::detail::add_class_method((object *)pcVar12,"matches",&local_b0);
  pybind11::object::~object((object *)&local_b0);
  local_a0._M_head_impl = (function_record *)kratos::EventTracingStmt::match_values_abi_cxx11_;
  local_98 = 0;
  pybind11::
  class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>::
  def_property_readonly<std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&(kratos::EventTracingStmt::*)()const>
            (pcVar12,"match_values",(offset_in_Var_to_subr *)&local_a0);
  pybind11::object::~object((object *)&assign_);
  pybind11::
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>::
  class_<>((class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>
            *)&local_80,(m->super_object).super_handle.m_ptr,"EventDelayStmt");
  local_60._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (tuple<pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
        )kratos::EventDelayStmt::event;
  unique_rec_6._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  this_00 = pybind11::
            class_<kratos::EventDelayStmt,std::shared_ptr<kratos::EventDelayStmt>,kratos::AuxiliaryStmt>
            ::def_property_readonly<kratos::EventControl_const&(kratos::EventDelayStmt::*)()const>
                      ((class_<kratos::EventDelayStmt,std::shared_ptr<kratos::EventDelayStmt>,kratos::AuxiliaryStmt>
                        *)&local_80,"event",(offset_in_Var_to_subr *)&local_60);
  pybind11::
  class_<kratos::EventDelayStmt,_std::shared_ptr<kratos::EventDelayStmt>,_kratos::AuxiliaryStmt>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            (this_00,"__init__",(type *)&local_50,(is_new_style_constructor *)&local_40);
  pybind11::object::~object((object *)&local_80);
  pybind11::class_<kratos::EventControl>::class_<>
            ((class_<kratos::EventControl> *)&local_60,(m->super_object).super_handle.m_ptr,
             "EventControl");
  pybind11::class_<kratos::EventControl>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::EventControl> *)&local_60,"__init__",(type *)&local_80,
             (is_new_style_constructor *)&local_50);
  pybind11::class_<kratos::EventControl>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            ((class_<kratos::EventControl> *)&local_60,"__init__",(type *)&local_80,
             (is_new_style_constructor *)&local_50);
  pcVar13 = pybind11::class_<kratos::EventControl>::
            def_readwrite<kratos::EventControl,kratos::EventControl::DelaySide>
                      ((class_<kratos::EventControl> *)&local_60,"delay_side",0x18);
  pcVar13 = pybind11::class_<kratos::EventControl>::
            def_readwrite<kratos::EventControl,unsigned_long>(pcVar13,"delay",0);
  pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>
            (pcVar13,"edge",0x14);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object((object *)&local_d8);
  pybind11::object::~object((object *)&local_c0);
  return;
}

Assistant:

void init_stmt(py::module &m) {
    using namespace kratos;
    py::class_<Stmt, ::shared_ptr<Stmt>> stmt_(m, "Stmt");
    stmt_.def(py::init<StatementType>())
        .def("type", &Stmt::type)
        .def("add_scope_variable", &Stmt::add_scope_variable)
        .def("add_scope_variable",
             [](Stmt &stmt, const std::string &name, const std::string &value, bool is_var) {
                 stmt.add_scope_variable(name, value, is_var, false);
             })
        .def_property_readonly("scope_context", [](Stmt &stmt) { return stmt.scope_context(); })
        .def("set_parent", &Stmt::set_parent)
        .def("clone", &Stmt::clone);

    def_trace<py::class_<Stmt, ::shared_ptr<Stmt>>, Stmt>(stmt_);
    def_attributes<py::class_<Stmt, ::shared_ptr<Stmt>>, Stmt>(stmt_);

    py::class_<AssignStmt, ::shared_ptr<AssignStmt>, Stmt> assign_(
        m, "AssignStmt", R"pbdoc(Assignment statement)pbdoc");
    assign_.def("assign_type", &AssignStmt::assign_type)
        .def("set_assign_type", &AssignStmt::set_assign_type)
        .def_property_readonly(
            "left", [](const AssignStmt &stmt) { return stmt.left(); },
            py::return_value_policy::reference)
        .def_property_readonly(
            "right", [](const AssignStmt &stmt) { return stmt.right(); },
            py::return_value_policy::reference)
        .def_property("delay", &AssignStmt::get_delay, &AssignStmt::set_delay)
        .def_property_readonly("has_delay", &AssignStmt::has_delay);

    py::class_<IfStmt, ::shared_ptr<IfStmt>, Stmt>(m, "IfStmt")
        .def(py::init<::shared_ptr<Var>>())
        .def("predicate", &IfStmt::predicate, py::return_value_policy::reference)
        .def("then_body", &IfStmt::then_body)
        .def_property_readonly("then_", &IfStmt::then_body)
        .def_property_readonly("else_", &IfStmt::else_body)
        .def("else_body", &IfStmt::else_body)
        .def("add_then_stmt", py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::add_then_stmt))
        .def("add_else_stmt", py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::add_else_stmt))
        .def("remove_then_stmt",
             py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::remove_then_stmt))
        .def("remove_else_stmt",
             py::overload_cast<const ::shared_ptr<Stmt> &>(&IfStmt::remove_else_stmt));

    py::class_<SwitchStmt, ::shared_ptr<SwitchStmt>, Stmt>(m, "SwitchStmt")
        .def(py::init<const ::shared_ptr<Var> &>())
        .def("add_switch_case",
             py::overload_cast<const std::shared_ptr<Const> &, const std::shared_ptr<Stmt> &>(
                 &SwitchStmt::add_switch_case))
        .def("add_switch_case", py::overload_cast<const std::shared_ptr<Const> &,
                                                  const std::vector<std::shared_ptr<Stmt>> &>(
                                    &SwitchStmt::add_switch_case))
        .def("target", &SwitchStmt::target, py::return_value_policy::reference)
        .def("body", &SwitchStmt::body)
        .def("remove_switch_case", py::overload_cast<const std::shared_ptr<kratos::Const> &>(
                                       &SwitchStmt::remove_switch_case))
        .def("remove_switch_case",
             py::overload_cast<const std::shared_ptr<Const> &, const std::shared_ptr<Stmt> &>(
                 &SwitchStmt::remove_switch_case));

    py::class_<StmtBlock, ::shared_ptr<StmtBlock>, Stmt>(m, "StmtBlock")
        .def("block_type", &StmtBlock::block_type)
        .def("add_stmt", py::overload_cast<const ::shared_ptr<Stmt> &>(&StmtBlock::add_stmt))
        .def("remove_stmt", &StmtBlock::remove_stmt)
        .def("add_stmt", &add_function_call_var)
        .def("__getitem__",
             [](StmtBlock &stmt, int index) {
                 if (stmt.empty()) {
                     throw UserException("Index of out range");
                 }
                 while (index < 0) {
                     index += stmt.size();
                 }
                 return stmt.get_stmt(index);
             })
        .def("__setitem__",
             [](StmtBlock &stmt, int index, const std::shared_ptr<Stmt> &value) {
                 if (stmt.empty()) {
                     throw UserException("Index of out range");
                 }
                 while (index < 0) {
                     index += stmt.size();
                 }
                 stmt.set_child(index, value);
             })
        .def("__len__", [](StmtBlock &stmt) { return stmt.size(); })
        .def(
            "__iter__", [](StmtBlock &stmt) { return py::make_iterator(stmt.begin(), stmt.end()); },
            py::keep_alive<0, 1>());

    py::class_<CombinationalStmtBlock, ::shared_ptr<CombinationalStmtBlock>, StmtBlock>(
        m, "CombinationalStmtBlock")
        .def(py::init<>())
        .def_property("general_purpose", &CombinationalStmtBlock::is_general_purpose,
                      &CombinationalStmtBlock::set_general_purpose);

    py::class_<LatchStmtBlock, ::shared_ptr<LatchStmtBlock>, StmtBlock>(m, "LatchStmtBlock")
        .def(py::init<>());

    py::class_<ScopedStmtBlock, ::shared_ptr<ScopedStmtBlock>, StmtBlock>(m, "ScopedStmtBlock")
        .def(py::init<>());

    py::class_<SequentialStmtBlock, ::shared_ptr<SequentialStmtBlock>, StmtBlock>(
        m, "SequentialStmtBlock")
        .def(py::init<>())
        .def("get_event_controls", py::overload_cast<>(&SequentialStmtBlock::get_event_controls))
        .def("add_condition", &SequentialStmtBlock::add_condition);

    py::class_<ModuleInstantiationStmt, ::shared_ptr<ModuleInstantiationStmt>, Stmt>(
        m, "ModuleInstantiationStmt")
        .def(py::init<Generator *, Generator *>());

    py::class_<ReturnStmt, std::shared_ptr<ReturnStmt>, Stmt>(m, "ReturnStmt");  // NOLINT
    py::class_<FunctionStmtBlock, std::shared_ptr<FunctionStmtBlock>, StmtBlock>(
        m, "FunctionStmtBlock")
        .def("input", &FunctionStmtBlock::input)
        .def("return_stmt", &FunctionStmtBlock::return_stmt)
        .def("get_port", &FunctionStmtBlock::get_port)
        .def("set_port_ordering", py::overload_cast<const std::map<std::string, uint32_t> &>(
                                      &FunctionStmtBlock::set_port_ordering))
        .def("set_port_ordering", py::overload_cast<const std::map<uint32_t, std::string> &>(
                                      &FunctionStmtBlock::set_port_ordering));

    py::class_<TaskStmtBlock, std::shared_ptr<TaskStmtBlock>, FunctionStmtBlock>(m,
                                                                                 "TaskStmtBlock");

    py::class_<DPIFunctionStmtBlock, std::shared_ptr<DPIFunctionStmtBlock>, FunctionStmtBlock>(
        m, "DPIFunctionStmtBlock")
        .def("input", &DPIFunctionStmtBlock::input)
        .def("output", &DPIFunctionStmtBlock::output)
        .def("set_return_width", &DPIFunctionStmtBlock::set_return_width)
        .def("is_pure", &DPIFunctionStmtBlock::is_pure)
        .def("is_context", &DPIFunctionStmtBlock::is_context)
        .def("set_is_pure", &DPIFunctionStmtBlock::set_is_pure)
        .def("set_is_context", &DPIFunctionStmtBlock::set_is_context);

    py::class_<BuiltInFunctionStmtBlock, std::shared_ptr<BuiltInFunctionStmtBlock>,
               FunctionStmtBlock>(m, "BuiltInFunctionStmtBlock")
        .def("return_width", &BuiltInFunctionStmtBlock::return_width);

    py::class_<InitialStmtBlock, std::shared_ptr<InitialStmtBlock>, StmtBlock>(m,  // NOLINT
                                                                               "InitialStmtBlock");

    py::class_<FinalStmtBlock, std::shared_ptr<FinalStmtBlock>, StmtBlock>(m,  // NOLINT
                                                                           "FinalStmtBlock");

    py::class_<CommentStmt, std::shared_ptr<CommentStmt>, Stmt>(m, "CommentStmt")
        .def(py::init<const std::string>());
    // help function
    m.def("comment", [](const std::string &comment) {
         auto stmt = std::make_shared<CommentStmt>(comment);
         return stmt;
     }).def("comment", [](const std::string &comment, uint32_t line_width) {
        auto stmt = std::make_shared<CommentStmt>(comment, line_width);
        return stmt;
    });

    py::class_<RawStringStmt, std::shared_ptr<RawStringStmt>, Stmt>(m, "RawStringStmt")
        .def(py::init<const std::string &>())
        .def(py::init<const std::vector<std::string> &>());

    py::class_<ForStmt, std::shared_ptr<ForStmt>, Stmt>(m, "ForStmt")
        .def(py::init<const std::string &, int64_t, int64_t, int64_t>())
        .def("get_iter_var", &ForStmt::get_iter_var)
        .def("add_stmt", &ForStmt::add_stmt)
        .def("add_stmt",
             [](ForStmt &for_, const std::shared_ptr<FunctionCallVar> &var) {
                 add_function_call_var(*for_.get_loop_body(), var);
             })
        .def("get_loop_body", &ForStmt::get_loop_body);

    py::class_<BreakStmt, std::shared_ptr<BreakStmt>, Stmt>(m, "BreakStmt").def(py::init<>());

    py::class_<AuxiliaryStmt, std::shared_ptr<AuxiliaryStmt>, Stmt>(m, "AuxiliaryStmt")
        .def("aux", &AuxiliaryStmt::aux_type);

    py::class_<EventTracingStmt, std::shared_ptr<EventTracingStmt>, AuxiliaryStmt>(
        m, "EventTracingStmt")
        .def("terminates", py::overload_cast<>(&EventTracingStmt::terminates))
        .def("terminates", py::overload_cast<const std::string &>(&EventTracingStmt::terminates))
        .def("belongs", &EventTracingStmt::belongs)
        .def("belongs",
             [](EventTracingStmt &stmt, const Transaction &t) { return stmt.belongs(t.name); })
        .def("belongs",
             [](EventTracingStmt &stmt, const Transaction &t, const std::string &filename,
                uint64_t ln) {
                 auto s = stmt.belongs(t.name);
                 s->fn_name_ln.emplace_back(std::make_pair(filename, ln));
                 return s;
             })
        .def("starts", py::overload_cast<>(&EventTracingStmt::starts))
        .def("starts", py::overload_cast<const std::string &>(&EventTracingStmt::starts))
        .def("matches", &EventTracingStmt::matches)
        .def("matches",
             [](std::shared_ptr<EventTracingStmt> &stmt, const py::kwargs &kwargs) {
                 for (auto const &[n, v] : kwargs) {
                     auto name = py::cast<std::string>(n);
                     auto var = py::cast<std::shared_ptr<Var>>(v);
                     stmt->matches(name, var);
                 }
                 return stmt;
             })
        .def_property_readonly("match_values", &EventTracingStmt::match_values);

    py::class_<EventDelayStmt, std::shared_ptr<EventDelayStmt>, AuxiliaryStmt>(m, "EventDelayStmt")
        .def_property_readonly("event", &EventDelayStmt::event)
        .def(py::init<EventControl>());

    // event control
    py::class_<EventControl>(m, "EventControl")
        .def(py::init<uint64_t>())
        .def(py::init<EventEdgeType, Var &>())
        .def_readwrite("delay_side", &EventControl::delay_side)
        .def_readwrite("delay", &EventControl::delay)
        .def_readwrite("edge", &EventControl::edge);
}